

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

SshChannel * wrap_lportfwd_open(ConnectionLayer *cl,char *hostname,int port,Socket *s,Channel *chan)

{
  SocketPeerInfo *pi;
  char *ptr;
  SshChannel *pSVar1;
  
  pi = (*s->vt->peer_info)(s);
  if ((pi == (SocketPeerInfo *)0x0) || (pi->log_text == (char *)0x0)) {
    ptr = dupstr("forwarding");
  }
  else {
    ptr = dupprintf("forwarding from %s");
  }
  pSVar1 = (*cl->vt->lportfwd_open)(cl,hostname,port,ptr,pi,chan);
  sk_free_peer_info(pi);
  safefree(ptr);
  return pSVar1;
}

Assistant:

static SshChannel *wrap_lportfwd_open(
    ConnectionLayer *cl, const char *hostname, int port,
    Socket *s, Channel *chan)
{
    SocketPeerInfo *pi;
    char *description;
    SshChannel *toret;

    pi = sk_peer_info(s);
    if (pi && pi->log_text) {
        description = dupprintf("forwarding from %s", pi->log_text);
    } else {
        description = dupstr("forwarding");
    }
    toret = ssh_lportfwd_open(cl, hostname, port, description, pi, chan);
    sk_free_peer_info(pi);

    sfree(description);
    return toret;
}